

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_elements_transaction.cpp
# Opt level: O3

void __thiscall
cfd::ConfidentialTransactionContext::AddPeginTxIn
          (ConfidentialTransactionContext *this,OutPoint *outpoint,Amount *amount,
          ConfidentialAssetId *asset_id,BlockHash *mainchain_genesis_block_hash,Script *claim_script
          ,ByteData *mainchain_pegin_transaction,ByteData *tx_out_proof)

{
  uint32_t uVar1;
  bool bVar2;
  uint32_t index;
  uint32_t local_114;
  ByteData local_110;
  Script *local_f8;
  ScriptWitness local_f0;
  ScriptWitness local_d0;
  ScriptWitness local_b0;
  ScriptWitness local_90;
  ScriptWitness local_70;
  ScriptWitness local_50;
  
  local_114 = 0;
  local_f8 = claim_script;
  bVar2 = IsFindTxIn(this,outpoint,&local_114);
  if (!bVar2) {
    local_114 = (*(this->super_ConfidentialTransaction).super_AbstractTransaction.
                  _vptr_AbstractTransaction[0x11])(this,outpoint);
  }
  uVar1 = local_114;
  core::Amount::GetByteData(&local_110,amount);
  core::ConfidentialTransaction::AddPeginWitnessStack
            (&local_50,&this->super_ConfidentialTransaction,uVar1,&local_110);
  local_50._vptr_ScriptWitness = (_func_int **)&PTR__ScriptWitness_00723678;
  std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::~vector
            (&local_50.witness_stack_);
  if (local_110.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_110.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  uVar1 = local_114;
  core::ConfidentialAssetId::GetUnblindedData(&local_110,asset_id);
  core::ConfidentialTransaction::AddPeginWitnessStack
            (&local_70,&this->super_ConfidentialTransaction,uVar1,&local_110);
  local_70._vptr_ScriptWitness = (_func_int **)&PTR__ScriptWitness_00723678;
  std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::~vector
            (&local_70.witness_stack_);
  if (local_110.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_110.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  uVar1 = local_114;
  core::BlockHash::GetData(&local_110,mainchain_genesis_block_hash);
  core::ConfidentialTransaction::AddPeginWitnessStack
            (&local_90,&this->super_ConfidentialTransaction,uVar1,&local_110);
  local_90._vptr_ScriptWitness = (_func_int **)&PTR__ScriptWitness_00723678;
  std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::~vector
            (&local_90.witness_stack_);
  if (local_110.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_110.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  uVar1 = local_114;
  core::Script::GetData(&local_110,local_f8);
  core::ConfidentialTransaction::AddPeginWitnessStack
            (&local_b0,&this->super_ConfidentialTransaction,uVar1,&local_110);
  local_b0._vptr_ScriptWitness = (_func_int **)&PTR__ScriptWitness_00723678;
  std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::~vector
            (&local_b0.witness_stack_);
  if (local_110.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_110.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  core::ConfidentialTransaction::AddPeginWitnessStack
            (&local_d0,&this->super_ConfidentialTransaction,local_114,mainchain_pegin_transaction);
  local_d0._vptr_ScriptWitness = (_func_int **)&PTR__ScriptWitness_00723678;
  std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::~vector
            (&local_d0.witness_stack_);
  core::ConfidentialTransaction::AddPeginWitnessStack
            (&local_f0,&this->super_ConfidentialTransaction,local_114,tx_out_proof);
  local_f0._vptr_ScriptWitness = (_func_int **)&PTR__ScriptWitness_00723678;
  std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::~vector
            (&local_f0.witness_stack_);
  return;
}

Assistant:

void ConfidentialTransactionContext::AddPeginTxIn(  // AddPeginWitness
    const OutPoint& outpoint, const Amount& amount,
    const ConfidentialAssetId& asset_id,
    const BlockHash& mainchain_genesis_block_hash, const Script& claim_script,
    const ByteData& mainchain_pegin_transaction,
    const ByteData& tx_out_proof) {
  uint32_t index = 0;
  if (!IsFindTxIn(outpoint, &index)) {
    index = AddTxIn(outpoint);
  }
  AddPeginWitnessStack(index, amount.GetByteData());
  AddPeginWitnessStack(index, asset_id.GetUnblindedData());
  AddPeginWitnessStack(index, mainchain_genesis_block_hash.GetData());
  AddPeginWitnessStack(index, claim_script.GetData());
  AddPeginWitnessStack(index, mainchain_pegin_transaction);
  AddPeginWitnessStack(index, tx_out_proof);
}